

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

int __thiscall
re2::Compiler::UncachedRuneByteSuffix(Compiler *this,uint8_t lo,uint8_t hi,bool foldcase,int next)

{
  PatchList PVar1;
  Frag FVar2;
  long in_RDI;
  PatchList in_R8D;
  Frag f;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  uint32_t uVar3;
  Compiler *in_stack_ffffffffffffffe8;
  
  FVar2 = ByteRange(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,
                    SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0));
  if (in_R8D.p == 0) {
    PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x21d4c7);
    PVar1 = PatchList::Append((Inst *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                              in_R8D,FVar2.end.p);
    uVar3 = FVar2.begin;
    *(uint32_t *)(in_RDI + 0x8c) = PVar1.p;
  }
  else {
    PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x21d49f);
    PatchList::Patch((Inst *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     FVar2.end.p,(uint32_t)((ulong)in_RDI >> 0x20));
    uVar3 = FVar2.begin;
  }
  return uVar3;
}

Assistant:

int Compiler::UncachedRuneByteSuffix(uint8_t lo, uint8_t hi, bool foldcase,
                                     int next) {
  Frag f = ByteRange(lo, hi, foldcase);
  if (next != 0) {
    PatchList::Patch(inst_.data(), f.end, next);
  } else {
    rune_range_.end = PatchList::Append(inst_.data(), rune_range_.end, f.end);
  }
  return f.begin;
}